

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void add_bridge_stones(EVdfg dfg,EVdfg_configuration config)

{
  int iVar1;
  uint uVar2;
  EVdfg_stone_state p_Var3;
  EVint_node_list p_Var4;
  _EVdfg_config_action *p_Var5;
  CManager cm;
  FILE *__stream;
  EVdfg_config_action act_00;
  EVdfg_config_action act_01;
  int iVar6;
  __pid_t _Var7;
  EVdfg_stone *pp_Var8;
  EVdfg_stone_state p_Var9;
  pthread_t pVar10;
  char **ppcVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int j;
  long lVar16;
  EVdfg_stone_state p_Var17;
  EVdfg_config_action act;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined8 uStack_38;
  
  lVar15 = 0;
  do {
    if (config->stone_count <= lVar15) {
      return;
    }
    lVar16 = 0;
    while( true ) {
      p_Var3 = config->stones[lVar15];
      if (p_Var3->out_count <= lVar16) break;
      uVar12 = (ulong)(uint)config->stone_count;
      if (config->stone_count < 1) {
        uVar12 = 0;
      }
      p_Var17 = (EVdfg_stone_state)0x0;
      for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        p_Var9 = config->stones[uVar13];
        if (p_Var9->stone_id == p_Var3->out_links[lVar16]) {
          p_Var17 = p_Var9;
        }
      }
      if ((p_Var17 != (EVdfg_stone_state)0x0) && (p_Var3->bridge_stone == 0)) {
        iVar6 = p_Var3->node;
        iVar1 = p_Var17->node;
        if (iVar6 != iVar1) {
          p_Var4 = dfg->master->nodes;
          ppcVar11 = &dfg->master->my_contact_str;
          if (p_Var4[iVar1].self == 0) {
            ppcVar11 = &p_Var4[iVar1].str_contact_list;
          }
          act.u.bridge.action = INT_create_bridge_action_spec(p_Var17->stone_id,*ppcVar11);
          act.type = ACT_create_bridge;
          act.u.bridge.target_id = p_Var17->stone_id;
          uVar2 = dfg->stone_count;
          dfg->stone_count = uVar2 + 1;
          act.stone_id = uVar2 | 0x80000000;
          pp_Var8 = (EVdfg_stone *)INT_CMrealloc(dfg->stones,(long)(int)uVar2 * 8 + 8);
          dfg->stones = pp_Var8;
          pp_Var8[(long)dfg->stone_count + -1] = (EVdfg_stone)0x0;
          act_00.stone_id = act.stone_id;
          act_00.type = act.type;
          act_00._12_4_ = act._12_4_;
          act_00.node_for_action = iVar6;
          act_00.u._12_4_ = act.u._12_4_;
          act_00.u.bridge.target_id = act.u.bridge.target_id;
          act_00.u.period = act.u.period;
          act.node_for_action = iVar6;
          EVdfg_perform_act_on_state(dfg->working_state,act_00,1);
          iVar1 = act.stone_id;
          act_01.stone_id = act.stone_id;
          act_01.type = 5;
          act_01._12_4_ = uStack_44;
          act_01.node_for_action = iVar6;
          act_01.u.period.usecs = p_Var17->stone_id;
          act_01.u.period.secs = local_40;
          act_01.u._8_8_ = uStack_38;
          EVdfg_perform_act_on_state(dfg->working_state,act_01,0);
          p_Var3->out_links[lVar16] = iVar1;
          uVar12 = (ulong)(uint)config->stone_count;
          if (config->stone_count < 1) {
            uVar12 = 0;
          }
          p_Var9 = (EVdfg_stone_state)0x0;
          for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
            if (config->stones[uVar13]->stone_id == iVar1) {
              p_Var9 = config->stones[uVar13];
            }
          }
          uVar12 = (ulong)(uint)config->pending_action_count;
          if (config->pending_action_count < 1) {
            uVar12 = 0;
          }
          for (lVar14 = 0; uVar12 * 0x20 != lVar14; lVar14 = lVar14 + 0x20) {
            p_Var5 = config->pending_action_queue;
            if (((*(uint *)((long)&p_Var5->type + lVar14) & 0xfffffffe) == 4) &&
               (*(int *)((long)&p_Var5->u + lVar14 + 4) == p_Var17->stone_id)) {
              *(int *)((long)&p_Var5->u + lVar14 + 4) = p_Var9->stone_id;
              break;
            }
          }
          p_Var9->node = p_Var3->node;
          cm = dfg->master->cm;
          iVar6 = CMtrace_val[0xd];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar6 = CMtrace_init(cm,EVdfgVerbose);
          }
          if (iVar6 != 0) {
            if (CMtrace_PID != 0) {
              __stream = (FILE *)dfg->master->cm->CMTrace_file;
              _Var7 = getpid();
              pVar10 = pthread_self();
              fprintf(__stream,"P%lxT%lx - ",(long)_Var7,pVar10);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&act);
              fprintf((FILE *)dfg->master->cm->CMTrace_file,"%lld.%.9ld - ",
                      CONCAT44(act.stone_id,act.type),CONCAT44(act._12_4_,act.node_for_action));
            }
            fprintf((FILE *)dfg->master->cm->CMTrace_file,
                    "Created bridge stone %x, target node is %d, assigned to node %d\n",
                    (ulong)(uint)p_Var3->out_links[lVar16],(ulong)(uint)p_Var17->node,
                    (ulong)(uint)p_Var3->node);
          }
          fflush((FILE *)dfg->master->cm->CMTrace_file);
        }
      }
      lVar16 = lVar16 + 1;
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

static void
add_bridge_stones(EVdfg dfg, EVdfg_configuration config)
{
    int i;
    for (i=0; i< config->stone_count; i++) {
	int j;
	for (j = 0; j < config->stones[i]->out_count; j++) {
	    EVdfg_stone_state cur = config->stones[i];
	    EVdfg_stone_state target = NULL;
	    int k;
	    for (k = 0; k < config->stone_count; k++) {
		if (config->stones[k]->stone_id == cur->out_links[j]) {
		    target = config->stones[k];
		}
	    }
	    if (target && (!cur->bridge_stone) && (cur->node != target->node)) {
		EVdfg_stone_state bridge = NULL;
		cur->out_links[j] = create_bridge_stone(dfg, target, cur->node);
		/* put the bridge stone where the source stone is */
		for (k = 0; k < config->stone_count; k++) {
		    if (config->stones[k]->stone_id == cur->out_links[j]) {
			bridge = config->stones[k];
		    }
		}
		for (k = 0; k < config->pending_action_count; k++) {
		    EVdfg_config_action act = config->pending_action_queue[k];
		    if (((act.type == ACT_link_port) || (act.type == ACT_link_dest)) &&
			(act.u.link.dest_id == target->stone_id)) {
			config->pending_action_queue[k].u.link.dest_id = bridge->stone_id;
			break;
		    }
		}
		bridge->node = cur->node;
		CMtrace_out(dfg->master->cm, EVdfgVerbose, "Created bridge stone %x, target node is %d, assigned to node %d\n", cur->out_links[j], target->node, cur->node);
	    }
	}
    }
}